

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

void Bt2_MatchFinder_Skip(void *_p,UInt32 num)

{
  uint lenLimit;
  UInt32 curMatch;
  UInt32 pos;
  ushort *cur;
  int iVar1;
  ulong uVar2;
  
  do {
    lenLimit = *(uint *)((long)_p + 0x14);
    if (lenLimit < 2) {
      MatchFinder_MovePos((CMatchFinder *)_p);
    }
    else {
      cur = *_p;
      uVar2 = (ulong)*cur;
      curMatch = *(UInt32 *)(*(long *)((long)_p + 0x28) + uVar2 * 4);
      pos = *(UInt32 *)((long)_p + 8);
      *(UInt32 *)(*(long *)((long)_p + 0x28) + uVar2 * 4) = pos;
      SkipMatchesSpec(lenLimit,curMatch,pos,(Byte *)cur,*(CLzRef **)((long)_p + 0x30),
                      (ulong)*(uint *)((long)_p + 0x18),*(UInt32 *)((long)_p + 0x1c),
                      *(UInt32 *)((long)_p + 0x3c));
      *(int *)((long)_p + 0x18) = *(int *)((long)_p + 0x18) + 1;
      *(long *)_p = *_p + 1;
      iVar1 = *(int *)((long)_p + 8) + 1;
      *(int *)((long)_p + 8) = iVar1;
      if (iVar1 == *(int *)((long)_p + 0xc)) {
        MatchFinder_CheckLimits((CMatchFinder *)_p);
      }
    }
    num = num - 1;
  } while (num != 0);
  return;
}

Assistant:

static void Bt2_MatchFinder_Skip(void *_p, UInt32 num)
{
  CMatchFinder *p = (CMatchFinder *)_p;
  SKIP_HEADER(2)
  {
    HASH2_CALC
    curMatch = p->hash[hv];
    p->hash[hv] = p->pos;
  }
  SKIP_FOOTER
}